

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydengine.cpp
# Opt level: O3

void __thiscall HydEngine::initMatrixSolver(HydEngine *this)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *extraout_RDX;
  char *__to;
  char *__to_00;
  char *extraout_RDX_00;
  size_type __n;
  ulong uVar4;
  undefined1 local_68 [8];
  vector<int,_std::allocator<int>_> node1;
  vector<int,_std::allocator<int>_> node2;
  
  uVar1 = Network::count(this->network,NODE);
  uVar2 = Network::count(this->network,LINK);
  __n = (size_type)(int)uVar2;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_68,__n,
             (allocator_type *)
             &node1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &node1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,__n,
             (allocator_type *)
             ((long)&node2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  if (0 < (int)uVar2) {
    uVar4 = 0;
    __to = extraout_RDX;
    do {
      iVar3 = Network::link(this->network,(char *)(uVar4 & 0xffffffff),__to);
      *(int *)((long)local_68 + uVar4 * 4) =
           *(int *)(*(long *)(CONCAT44(extraout_var,iVar3) + 0x30) + 0x28);
      iVar3 = Network::link(this->network,(char *)(uVar4 & 0xffffffff),__to_00);
      node1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage[uVar4] = *(int *)(*(long *)(CONCAT44(extraout_var_00,iVar3) + 0x38) + 0x28);
      uVar4 = uVar4 + 1;
      __to = extraout_RDX_00;
    } while (__n != uVar4);
  }
  (*this->matrixSolver->_vptr_MatrixSolver[2])
            (this->matrixSolver,(ulong)uVar1,(ulong)uVar2,local_68,
             node1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage);
  if (node1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage != (pointer)0x0) {
    operator_delete(node1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  }
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68);
  }
  return;
}

Assistant:

void HydEngine::initMatrixSolver()
{
    int nodeCount = network->count(Element::NODE);
    int linkCount = network->count(Element::LINK);
    try
    {
        // ... place the start/end node indexes of each network link in arrays

        vector<int> node1(linkCount);
        vector<int> node2(linkCount);
        for (int k = 0; k < linkCount; k++)
        {
            node1[k] = network->link(k)->fromNode->index;
            node2[k] = network->link(k)->toNode->index;
        }

        // ...  initialize the matrix solver

        matrixSolver->init(nodeCount, linkCount, (int *)&node1[0], (int *)&node2[0]);
    }
    catch (...)
    {
        throw;
    }
}